

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall soul::AST::CommaSeparatedList::~CommaSeparatedList(CommaSeparatedList *this)

{
  pool_ref<soul::AST::Expression> *ppVar1;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__CommaSeparatedList_002f6c20;
  (this->items).numActive = 0;
  if (4 < (this->items).numAllocated) {
    ppVar1 = (this->items).items;
    if (ppVar1 != (pool_ref<soul::AST::Expression> *)0x0) {
      operator_delete__(ppVar1);
    }
    (this->items).items = (pool_ref<soul::AST::Expression> *)(this->items).space;
    (this->items).numAllocated = 4;
  }
  ASTObject::~ASTObject((ASTObject *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

CommaSeparatedList (const Context& c)
            : Expression (ObjectType::CommaSeparatedList, c, ExpressionKind::unknown)
        {
        }